

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogmove.c
# Opt level: O0

boolean can_reach_location(monst *mon,xchar mx,xchar my,xchar fx,xchar fy)

{
  xchar x;
  boolean bVar1;
  int iVar2;
  int iVar3;
  int local_24;
  int dist;
  int j;
  int i;
  xchar fy_local;
  xchar fx_local;
  xchar my_local;
  xchar mx_local;
  monst *mon_local;
  xchar y;
  
  if ((mx == fx) && (my == fy)) {
    mon_local._7_1_ = '\x01';
  }
  else if ((mx < '\x01') || ((('O' < mx || (my < '\0')) || ('\x14' < my)))) {
    mon_local._7_1_ = '\0';
  }
  else {
    iVar2 = dist2((int)mx,(int)my,(int)fx,(int)fy);
    for (dist = mx + -1; dist <= mx + 1; dist = dist + 1) {
      for (local_24 = my + -1; local_24 <= my + 1; local_24 = local_24 + 1) {
        if (((0 < dist) && (dist < 0x50)) &&
           ((-1 < local_24 &&
            ((local_24 < 0x15 && (iVar3 = dist2(dist,local_24,(int)fx,(int)fy), iVar3 < iVar2))))))
        {
          x = (xchar)dist;
          y = (xchar)local_24;
          if (((('\x10' < level->locations[dist][local_24].typ) ||
               (((mon->data->mflags1 & 8) != 0 ||
                ((bVar1 = may_dig(level,x,y), bVar1 != '\0' && ((mon->data->mflags1 & 0x20) != 0))))
               )) && ((level->locations[dist][local_24].typ != '\x17' ||
                      ((*(uint *)&level->locations[dist][local_24].field_0x6 >> 4 & 0xc) == 0)))) &&
             ((bVar1 = could_reach_item(mon,x,y), bVar1 != '\0' &&
              (bVar1 = can_reach_location(mon,x,y,fx,fy), bVar1 != '\0')))) {
            return '\x01';
          }
        }
      }
    }
    mon_local._7_1_ = '\0';
  }
  return mon_local._7_1_;
}

Assistant:

static boolean can_reach_location(struct monst *mon,
				  xchar mx, xchar my, xchar fx, xchar fy)
{
    int i, j;
    int dist;

    if (mx == fx && my == fy) return TRUE;
    if (!isok(mx, my)) return FALSE; /* should not happen */
    
    dist = dist2(mx, my, fx, fy);
    for (i=mx-1; i<=mx+1; i++) {
	for (j=my-1; j<=my+1; j++) {
	    if (!isok(i, j))
		continue;
	    if (dist2(i, j, fx, fy) >= dist)
		continue;
	    if (IS_ROCK(level->locations[i][j].typ) && !passes_walls(mon->data) &&
				    (!may_dig(level, i,j) || !tunnels(mon->data)))
		continue;
	    if (IS_DOOR(level->locations[i][j].typ) &&
				(level->locations[i][j].doormask & (D_CLOSED | D_LOCKED)))
		continue;
	    if (!could_reach_item(mon, i, j))
		continue;
	    if (can_reach_location(mon, i, j, fx, fy))
		return TRUE;
	}
    }
    return FALSE;
}